

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseCameraChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  value_type paVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  reference ppaVar5;
  float fVar6;
  aiCamera *camera;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar2 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar2 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      iVar3 = chunkSize + -6;
    } while (iVar3 < 1);
    this_00 = this->stream;
    iVar4 = StreamReader<false,_false>::GetCurrentPos(this_00);
    uVar2 = StreamReader<false,_false>::SetReadLimit(this_00,iVar4 + iVar3);
    ppaVar5 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::back(&this->mScene->mCameras);
    paVar1 = *ppaVar5;
    if (oldReadLimit._2_2_ == 0x4720) {
      fVar6 = StreamReader<false,_false>::GetF4(this->stream);
      paVar1->mClipPlaneNear = fVar6;
      fVar6 = StreamReader<false,_false>::GetF4(this->stream);
      paVar1->mClipPlaneFar = fVar6;
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,uVar2);
    uVar2 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar2 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseCameraChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiCamera* camera = mScene->mCameras.back();

    // get chunk type
    switch (chunk.Flag)
    {
        // near and far clip plane
    case Discreet3DS::CHUNK_CAM_RANGES:
        camera->mClipPlaneNear = stream->GetF4();
        camera->mClipPlaneFar  = stream->GetF4();
        break;
    }

    ASSIMP_3DS_END_CHUNK();
}